

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# writer_suite.cpp
# Opt level: O1

void array_suite::fail_mismatched_end_assoc_array(void)

{
  vector<unsigned_char,_std::allocator<unsigned_char>_> result;
  writer writer;
  undefined4 local_bc;
  size_type local_b8 [4];
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_98;
  type local_78;
  _Deque_base<trial::protocol::bintoken::token::code::value,_std::allocator<trial::protocol::bintoken::token::code::value>_>
  local_68;
  
  local_98.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_98.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_98.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  trial::protocol::bintoken::basic_writer<16ul>::
  basic_writer<std::vector<unsigned_char,std::allocator<unsigned_char>>>
            ((basic_writer<16ul> *)&local_78.__align,&local_98);
  local_b8[0] = trial::protocol::bintoken::basic_writer<16UL>::
                overloader<trial::protocol::bintoken::token::begin_array,_void>::value
                          ((basic_writer<16UL> *)&local_78.__align);
  local_bc = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("writer.value<token::begin_array>()","1",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/writer_suite.cpp"
             ,0x239,"void array_suite::fail_mismatched_end_assoc_array()",local_b8,&local_bc);
  trial::protocol::bintoken::basic_writer<16UL>::
  overloader<trial::protocol::bintoken::token::end_assoc_array,_void>::value
            ((basic_writer<16UL> *)&local_78.__align);
  boost::detail::throw_failed_impl
            ("writer.value<token::end_assoc_array>()","format::error",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/writer_suite.cpp"
             ,0x23b,"void array_suite::fail_mismatched_end_assoc_array()");
  std::
  _Deque_base<trial::protocol::bintoken::token::code::value,_std::allocator<trial::protocol::bintoken::token::code::value>_>
  ::~_Deque_base(&local_68);
  (**(code **)local_78._0_8_)(&local_78);
  if (local_98.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_98.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_98.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_98.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void test_uint8()
{
    std::vector<output_type> result;
    format::writer writer(result);
    TRIAL_PROTOCOL_TEST_EQUAL(writer.value(std::uint8_t(0x00)), 1);
    TRIAL_PROTOCOL_TEST_EQUAL(writer.value(std::uint8_t(0x7F)), 1);
    TRIAL_PROTOCOL_TEST_EQUAL(writer.value(std::uint8_t(0xD0)), 2);
    TRIAL_PROTOCOL_TEST_EQUAL(writer.value(std::uint8_t(0xFF)), 1);
    TRIAL_PROTOCOL_TEST_EQUAL(result.size(), 5);
    TRIAL_PROTOCOL_TEST_EQUAL(result[0], 0x00);
    TRIAL_PROTOCOL_TEST_EQUAL(result[1], 0x7F);
    TRIAL_PROTOCOL_TEST_EQUAL(result[2], token::code::int8);
    TRIAL_PROTOCOL_TEST_EQUAL(result[3], 0xD0);
    TRIAL_PROTOCOL_TEST_EQUAL(result[4], 0xFF);
}